

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O2

int64_t __thiscall
aeron::ClientConductor::addPublication(ClientConductor *this,string *channel,int32_t streamId)

{
  PublicationStateDefn *pPVar1;
  bool bVar2;
  long lVar3;
  _Alloc_hider _Var4;
  long lVar5;
  __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
  __it;
  __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
  _Var6;
  int64_t registrationId;
  int32_t local_f4;
  PublicationStateDefn *local_f0;
  string *local_e8;
  pthread_mutex_t *local_e0;
  anon_class_40_2_b9c55019_for__M_pred local_d8;
  vector<aeron::ClientConductor::PublicationStateDefn,std::allocator<aeron::ClientConductor::PublicationStateDefn>>
  *local_b0;
  anon_class_40_2_b9c55019_for__M_pred local_a8;
  anon_class_40_2_b9c55019_for__M_pred local_80;
  anon_class_40_2_b9c55019_for__M_pred local_58;
  
  local_f4 = streamId;
  verifyDriverIsActive(this);
  ensureOpen(this);
  local_e0 = (pthread_mutex_t *)&this->m_adminLock;
  std::recursive_mutex::lock((recursive_mutex *)&local_e0->__data);
  __it._M_current =
       (this->m_publications).
       super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (this->m_publications).
           super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_e8 = channel;
  std::__cxx11::string::string((string *)&local_80,(string *)channel);
  local_80.streamId = streamId;
  addPublication(std::__cxx11::string_const&,int)::$_0::__0((__0 *)&local_58,&local_80);
  addPublication(std::__cxx11::string_const&,int)::$_0::__0((__0 *)&local_d8,&local_58);
  addPublication(std::__cxx11::string_const&,int)::$_0::__0((__0 *)&local_a8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  addPublication(std::__cxx11::string_const&,int)::$_0::__0((__0 *)&local_d8,&local_a8);
  local_b0 = (vector<aeron::ClientConductor::PublicationStateDefn,std::allocator<aeron::ClientConductor::PublicationStateDefn>>
              *)&this->m_publications;
  lVar5 = (long)pPVar1 - (long)__it._M_current;
  local_f0 = pPVar1;
  for (lVar3 = lVar5 / 0x90 >> 2; pPVar1 = local_f0, 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::$_0>
            ::operator()((_Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                          *)&local_d8,__it);
    _Var6._M_current = __it._M_current;
    if (bVar2) goto LAB_00149094;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::$_0>
            ::operator()((_Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                          *)&local_d8,__it._M_current + 1);
    _Var6._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_00149094;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::$_0>
            ::operator()((_Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                          *)&local_d8,__it._M_current + 2);
    _Var6._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_00149094;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::$_0>
            ::operator()((_Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                          *)&local_d8,__it._M_current + 3);
    _Var6._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_00149094;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x240;
  }
  lVar5 = lVar5 / 0x90;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var6._M_current = pPVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::$_0>
                  ::operator()((_Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                                *)&local_d8,__it), _Var6._M_current = __it._M_current, bVar2))
      goto LAB_00149094;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::$_0>
            ::operator()((_Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                          *)&local_d8,__it);
    _Var6._M_current = __it._M_current;
    if (bVar2) goto LAB_00149094;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::$_0>::
          operator()((_Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                      *)&local_d8,__it);
  _Var6._M_current = pPVar1;
  if (bVar2) {
    _Var6._M_current = __it._M_current;
  }
LAB_00149094:
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_80);
  if (_Var6._M_current ==
      (this->m_publications).
      super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_d8.channel._M_dataplus._M_p =
         (pointer)DriverProxy::addPublication(this->m_driverProxy,local_e8,local_f4);
    local_a8.channel._M_dataplus._M_p =
         (pointer)std::function<long_long_()>::operator()(&this->m_epochClock);
    std::
    vector<aeron::ClientConductor::PublicationStateDefn,std::allocator<aeron::ClientConductor::PublicationStateDefn>>
    ::emplace_back<std::__cxx11::string_const&,long&,int&,long_long>
              (local_b0,local_e8,(long *)&local_d8,&local_f4,(longlong *)&local_a8);
    _Var4._M_p = local_d8.channel._M_dataplus._M_p;
  }
  else {
    _Var4._M_p = (pointer)(_Var6._M_current)->m_registrationId;
  }
  pthread_mutex_unlock(local_e0);
  return (int64_t)_Var4._M_p;
}

Assistant:

std::int64_t ClientConductor::addPublication(const std::string &channel, std::int32_t streamId)
{
    verifyDriverIsActive();
    ensureOpen();

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);
    std::int64_t id;

    auto it = std::find_if(m_publications.begin(), m_publications.end(),
        [channel, streamId](const PublicationStateDefn &entry)
        {
            return (streamId == entry.m_streamId && channel == entry.m_channel);
        });

    if (it == m_publications.end())
    {
        std::int64_t registrationId = m_driverProxy.addPublication(channel, streamId);

        m_publications.emplace_back(channel, registrationId, streamId, m_epochClock());
        id = registrationId;
    }
    else
    {
        id = (*it).m_registrationId;
    }

    return id;
}